

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O2

bool slang::ast::requireLValueHelper<slang::ast::ElementSelectExpression>
               (ElementSelectExpression *expr,ASTContext *context,SourceLocation location,
               bitmask<slang::ast::AssignFlags> flags,Expression *longestStaticPrefix)

{
  ExpressionKind EVar1;
  Expression *this;
  int *piVar2;
  char cVar3;
  bool bVar4;
  Diagnostic *pDVar5;
  Type *this_00;
  DiagCode code;
  EvalContext evalCtx;
  
  this = expr->value_;
  EVar1 = this->kind;
  if ((EVar1 == Streaming) || (EVar1 == Concatenation)) {
    if (((ulong)location & 0xfffffff) == 0) {
      location = (expr->super_Expression).sourceRange.startLoc;
    }
    code.subsystem = Expressions;
    code.code = 0x56;
LAB_0034b5c6:
    pDVar5 = ASTContext::addDiag(context,code,location);
    Diagnostic::operator<<(pDVar5,(expr->super_Expression).sourceRange);
LAB_0034b5de:
    bVar4 = false;
  }
  else {
    if ((EVar1 & ~IntegerLiteral) == NamedValue) {
      piVar2 = *(int **)(this + 1);
      if ((*piVar2 == 0x3b) && (*(int *)(*(long *)(piVar2 + 0x54) + 0x80) == 0xe)) {
        pDVar5 = ASTContext::addDiag(context,(DiagCode)0xa80007,(expr->super_Expression).sourceRange
                                    );
        Diagnostic::operator<<(pDVar5,*(string_view *)(piVar2 + 2));
        goto LAB_0034b5de;
      }
      if ((flags.m_bits & 1) != 0) {
        this_00 = DeclaredType::getType((DeclaredType *)(piVar2 + 0x10));
        bVar4 = Type::isDynamicallySizedArray(this_00);
        if (bVar4) {
          if (((ulong)location & 0xfffffff) == 0) {
            location = (expr->super_Expression).sourceRange.startLoc;
          }
          code.subsystem = Expressions;
          code.code = 0x82;
          goto LAB_0034b5c6;
        }
      }
    }
    if (((context->flags).m_bits & 0x20) == 0) {
      evalCtx.astCtx.assertionInstance = context->assertionInstance;
      evalCtx.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_ =
           (pointer)evalCtx.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.firstElement
      ;
      evalCtx.astCtx.scope.ptr = (context->scope).ptr;
      evalCtx.astCtx.lookupIndex = context->lookupIndex;
      evalCtx.astCtx._12_4_ = *(undefined4 *)&context->field_0xc;
      evalCtx.astCtx.flags.m_bits = (context->flags).m_bits;
      evalCtx.astCtx.instanceOrProc = context->instanceOrProc;
      evalCtx.astCtx.firstTempVar = context->firstTempVar;
      evalCtx.astCtx.randomizeDetails = context->randomizeDetails;
      evalCtx.flags.m_bits = '\x02';
      evalCtx._60_8_ = 0;
      evalCtx._68_8_ = 0;
      evalCtx.queueTarget._4_4_ = 0;
      evalCtx.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.len = 0;
      evalCtx.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.cap = 2;
      evalCtx.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_ =
           (pointer)evalCtx.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.firstElement;
      evalCtx.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.len = 0;
      evalCtx.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.cap = 5;
      evalCtx.diags.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.data_ =
           (pointer)evalCtx.diags.super_SmallVector<slang::Diagnostic,_2UL>.
                    super_SmallVectorBase<slang::Diagnostic>.firstElement;
      evalCtx.diags.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.len = 0;
      evalCtx.diags.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.cap = 2;
      evalCtx.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.data_ =
           (pointer)evalCtx.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
                    super_SmallVectorBase<slang::Diagnostic>.firstElement;
      evalCtx.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.len = 0;
      evalCtx.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.cap = 2;
      evalCtx.disableRange.startLoc = (SourceLocation)0x0;
      evalCtx.disableRange.endLoc = (SourceLocation)0x0;
      evalCtx.backtraceReported = false;
      bVar4 = ElementSelectExpression::isConstantSelect(expr,&evalCtx);
      if (longestStaticPrefix != (Expression *)0x0) {
        expr = (ElementSelectExpression *)longestStaticPrefix;
      }
      if (!bVar4) {
        expr = (ElementSelectExpression *)0x0;
      }
      EvalContext::~EvalContext(&evalCtx);
    }
    else {
      ASTContext::eval((ConstantValue *)&evalCtx,context,expr->selector_,
                       (bitmask<slang::ast::EvalFlags>)0x0);
      cVar3 = (char)evalCtx.astCtx.firstTempVar;
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                           *)&evalCtx);
      if (cVar3 == '\0') {
        return false;
      }
      if (longestStaticPrefix != (Expression *)0x0) {
        expr = (ElementSelectExpression *)longestStaticPrefix;
      }
    }
    bVar4 = Expression::requireLValue(this,context,location,flags,&expr->super_Expression);
  }
  return bVar4;
}

Assistant:

bool requireLValueHelper(const T& expr, const ASTContext& context, SourceLocation location,
                         bitmask<AssignFlags> flags, const Expression* longestStaticPrefix) {
    auto& val = expr.value();
    if (val.kind == ExpressionKind::Concatenation || val.kind == ExpressionKind::Streaming) {
        // Selects of concatenations are not allowed to be lvalues.
        if (!location)
            location = expr.sourceRange.start();

        auto& diag = context.addDiag(diag::ExpressionNotAssignable, location);
        diag << expr.sourceRange;
        return false;
    }

    if (ValueExpressionBase::isKind(val.kind)) {
        auto& sym = val.template as<ValueExpressionBase>().symbol;
        if (sym.kind == SymbolKind::Net) {
            if (sym.template as<NetSymbol>().netType.netKind == NetType::UserDefined) {
                context.addDiag(diag::UserDefPartialDriver, expr.sourceRange) << sym.name;
                return false;
            }
        }

        if (flags.has(AssignFlags::NonBlocking) && sym.getType().isDynamicallySizedArray()) {
            if (!location)
                location = expr.sourceRange.start();

            context.addDiag(diag::NonblockingDynamicAssign, location) << expr.sourceRange;
            return false;
        }
    }

    if (context.flags.has(ASTFlags::NonProcedural)) {
        if constexpr (std::is_same_v<T, RangeSelectExpression>) {
            if (!context.eval(expr.left()) || !context.eval(expr.right()))
                return false;
        }
        else {
            if (!context.eval(expr.selector()))
                return false;
        }

        if (!longestStaticPrefix)
            longestStaticPrefix = &expr;
    }
    else {
        EvalContext evalCtx(context, EvalFlags::CacheResults);
        if (expr.isConstantSelect(evalCtx)) {
            if (!longestStaticPrefix)
                longestStaticPrefix = &expr;
        }
        else {
            longestStaticPrefix = nullptr;
        }
    }

    return val.requireLValue(context, location, flags, longestStaticPrefix);
}